

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_avx2.c
# Opt level: O3

void av1_highbd_quantize_fp_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  uint uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  auVar1 = *(undefined1 (*) [16])round_ptr;
  if (log_scale != 0) {
    auVar8._0_2_ = (undefined2)(1 << (0xfU - (char)log_scale & 0x1f));
    auVar8._2_2_ = auVar8._0_2_;
    auVar8._4_2_ = auVar8._0_2_;
    auVar8._6_2_ = auVar8._0_2_;
    auVar8._8_2_ = auVar8._0_2_;
    auVar8._10_2_ = auVar8._0_2_;
    auVar8._12_2_ = auVar8._0_2_;
    auVar8._14_2_ = auVar8._0_2_;
    auVar1 = vpmulhrsw_avx(auVar1,auVar8);
  }
  auVar8 = vpmovzxwd_avx(auVar1);
  auVar1 = vpunpckhwd_avx(auVar1,(undefined1  [16])0x0);
  auVar12._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar8;
  auVar12._16_16_ = ZEXT116(1) * auVar1;
  auVar1 = vpmovzxwd_avx(*(undefined1 (*) [16])quant_ptr);
  auVar8 = vpunpckhwd_avx(*(undefined1 (*) [16])quant_ptr,(undefined1  [16])0x0);
  auVar13._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar1;
  auVar13._16_16_ = ZEXT116(1) * auVar8;
  auVar1 = vpmovzxwd_avx(*(undefined1 (*) [16])dequant_ptr);
  auVar8 = vpunpckhwd_avx(*(undefined1 (*) [16])dequant_ptr,(undefined1  [16])0x0);
  auVar11 = *(undefined1 (*) [32])coeff_ptr;
  auVar2 = vpabsd_avx2(auVar11);
  auVar9 = vpaddd_avx2(auVar2,auVar12);
  auVar10 = vpmuldq_avx2(auVar9,auVar13);
  auVar9 = vpsrlq_avx2(auVar9,0x20);
  auVar14 = vpsrlq_avx2(auVar13,0x20);
  auVar9 = vpmuldq_avx2(auVar9,auVar14);
  uVar6 = 0x10 - log_scale;
  auVar10 = vpsrlq_avx2(auVar10,ZEXT416(uVar6));
  auVar9 = vpsrlq_avx2(auVar9,ZEXT416(uVar6));
  auVar14._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar1;
  auVar14._16_16_ = ZEXT116(1) * auVar8;
  auVar9 = vpsllq_avx2(auVar9,0x20);
  auVar9 = vpor_avx2(auVar9,auVar10);
  auVar2 = vpslld_avx2(auVar2,ZEXT416(log_scale + 1));
  auVar2 = vpcmpgtd_avx2(auVar14,auVar2);
  auVar2 = vpandn_avx2(auVar2,auVar9);
  auVar9 = vpmulld_avx2(auVar2,auVar14);
  auVar9 = vpsrad_avx2(auVar9,ZEXT416((uint)log_scale));
  auVar2 = vpsignd_avx2(auVar2,auVar11);
  auVar11 = vpsignd_avx2(auVar9,auVar11);
  *(undefined1 (*) [32])qcoeff_ptr = auVar2;
  *(undefined1 (*) [32])dqcoeff_ptr = auVar11;
  auVar1 = vpmovzxwd_avx(*(undefined1 (*) [16])iscan);
  auVar8 = vpunpckhwd_avx(*(undefined1 (*) [16])iscan,(undefined1  [16])0x0);
  auVar9._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar1;
  auVar9._16_16_ = ZEXT116(1) * auVar8;
  auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar2 = vpcmpeqd_avx2(auVar11,auVar10);
  auVar11 = vpaddd_avx2(auVar9,auVar2);
  auVar9 = vpcmpeqd_avx2(auVar9,auVar9);
  auVar11 = vpsubd_avx2(auVar11,auVar9);
  auVar11 = vpandn_avx2(auVar2,auVar11);
  if (8 < n_coeffs) {
    auVar13 = vpermq_avx2(auVar13,0xee);
    auVar12 = vpermq_avx2(auVar12,0xee);
    auVar2 = vpblendw_avx2(auVar10,auVar13,0x11);
    auVar15 = vpsrlq_avx2(auVar13,0x20);
    auVar13 = vpermq_avx2(auVar14,0xee);
    uVar5 = n_coeffs + 8;
    lVar7 = 0x10;
    do {
      auVar14 = *(undefined1 (*) [32])((long)coeff_ptr + lVar7 * 2);
      auVar3 = vpabsd_avx2(auVar14);
      auVar16 = vpaddd_avx2(auVar3,auVar12);
      auVar4 = vpmuldq_avx2(auVar16,auVar2);
      auVar16 = vpsrlq_avx2(auVar16,0x20);
      auVar4 = vpsrlq_avx2(auVar4,ZEXT416(uVar6));
      auVar16 = vpmuldq_avx2(auVar16,auVar15);
      auVar16 = vpsrlq_avx2(auVar16,ZEXT416(uVar6));
      auVar16 = vpsllq_avx2(auVar16,0x20);
      auVar16 = vpor_avx2(auVar16,auVar4);
      auVar3 = vpslld_avx2(auVar3,ZEXT416(log_scale + 1));
      auVar3 = vpcmpgtd_avx2(auVar13,auVar3);
      auVar3 = vpandn_avx2(auVar3,auVar16);
      auVar16 = vpmulld_avx2(auVar3,auVar13);
      auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)log_scale));
      auVar3 = vpsignd_avx2(auVar3,auVar14);
      auVar14 = vpsignd_avx2(auVar16,auVar14);
      *(undefined1 (*) [32])((long)qcoeff_ptr + lVar7 * 2) = auVar3;
      *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar7 * 2) = auVar14;
      auVar1 = vpmovzxwd_avx(*(undefined1 (*) [16])((long)iscan + lVar7));
      auVar8 = vpunpckhwd_avx(*(undefined1 (*) [16])((long)iscan + lVar7),(undefined1  [16])0x0);
      auVar16._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar1;
      auVar16._16_16_ = ZEXT116(1) * auVar8;
      auVar3 = vpcmpeqd_avx2(auVar14,auVar10);
      auVar14 = vpaddd_avx2(auVar16,auVar3);
      auVar14 = vpsubd_avx2(auVar14,auVar9);
      auVar14 = vpandn_avx2(auVar3,auVar14);
      auVar11 = vpmaxsd_avx2(auVar14,auVar11);
      lVar7 = lVar7 + 0x10;
      uVar5 = uVar5 - 8;
    } while (0x10 < uVar5);
  }
  auVar2 = vpshufd_avx2(auVar11,0xe);
  auVar11 = vpmaxsw_avx2(auVar11,auVar2);
  auVar2 = vpshuflw_avx2(auVar11,0xe);
  auVar11 = vpmaxsw_avx2(auVar11,auVar2);
  auVar2 = vpshuflw_avx2(auVar11,1);
  auVar11 = vpmaxsw_avx2(auVar11,auVar2);
  auVar1 = vpmaxsw_avx(auVar11._0_16_,auVar11._16_16_);
  vpextrw_avx(auVar1,0);
  return;
}

Assistant:

void av1_highbd_quantize_fp_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  (void)scan;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  const unsigned int step = 8;
  __m256i qp[3], coeff;

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, qp);
  coeff = _mm256_loadu_si256((const __m256i *)coeff_ptr);

  __m256i eob = _mm256_setzero_si256();
  quantize(qp, &coeff, iscan, log_scale, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);
  while (n_coeffs > 0) {
    coeff = _mm256_loadu_si256((const __m256i *)coeff_ptr);
    quantize(qp, &coeff, iscan, log_scale, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }
  {
    __m256i eob_s;
    eob_s = _mm256_shuffle_epi32(eob, 0xe);
    eob = _mm256_max_epi16(eob, eob_s);
    eob_s = _mm256_shufflelo_epi16(eob, 0xe);
    eob = _mm256_max_epi16(eob, eob_s);
    eob_s = _mm256_shufflelo_epi16(eob, 1);
    eob = _mm256_max_epi16(eob, eob_s);
    const __m128i final_eob = _mm_max_epi16(_mm256_castsi256_si128(eob),
                                            _mm256_extractf128_si256(eob, 1));
    *eob_ptr = _mm_extract_epi16(final_eob, 0);
  }
}